

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateCompatibleInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gtarget,ImportPropertyMap *properties)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  TargetType TVar3;
  cmMakefile *this_00;
  cmComputeLinkInformation *this_01;
  ItemVector *pIVar4;
  cmLocalGenerator *this_02;
  string *psVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  cmExportFileGenerator *pcVar8;
  pointer pIVar9;
  ostringstream e;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifaceProperties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string *local_228;
  string local_220;
  undefined1 local_200 [112];
  ios_base local_190 [264];
  ImportPropertyMap *local_88;
  string *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_200._0_8_ = local_200 + 0x10;
  pcVar8 = (cmExportFileGenerator *)local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar8,"COMPATIBLE_INTERFACE_BOOL","");
  PopulateInterfaceProperty(pcVar8,(string *)local_200,gtarget,properties);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  pcVar8 = (cmExportFileGenerator *)local_200;
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar8,"COMPATIBLE_INTERFACE_STRING","")
  ;
  PopulateInterfaceProperty(pcVar8,(string *)local_200,gtarget,properties);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  pcVar8 = (cmExportFileGenerator *)local_200;
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
  PopulateInterfaceProperty(pcVar8,(string *)local_200,gtarget,properties);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  pcVar8 = (cmExportFileGenerator *)local_200;
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
  PopulateInterfaceProperty(pcVar8,(string *)local_200,gtarget,properties);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200._0_8_ = local_200 + 0x10;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"COMPATIBLE_INTERFACE_BOOL","");
  getPropertyContents(gtarget,(string *)local_200,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"COMPATIBLE_INTERFACE_STRING","");
  getPropertyContents(gtarget,(string *)local_200,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
  getPropertyContents(gtarget,(string *)local_200,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  local_200._0_8_ = local_200 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
  getPropertyContents(gtarget,(string *)local_200,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
  }
  TVar3 = cmGeneratorTarget::GetType(gtarget);
  if (TVar3 != INTERFACE_LIBRARY) {
    this_00 = cmTarget::GetMakefile(gtarget->Target);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_48,this_00,IncludeEmptyConfig);
    local_228 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_80 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_88 = properties;
      do {
        TVar3 = cmGeneratorTarget::GetType(gtarget);
        if (TVar3 != OBJECT_LIBRARY) {
          this_01 = cmGeneratorTarget::GetLinkInformation(gtarget,local_228);
          if (this_01 == (cmComputeLinkInformation *)0x0) {
            this_02 = cmGeneratorTarget::GetLocalGenerator(gtarget);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"Exporting the target \"",0x16);
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gtarget);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_200,(psVar5->_M_dataplus)._M_p,
                                psVar5->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" is not allowed since its linker language cannot be determined",
                       0x3f);
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this_02,FATAL_ERROR,&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
            std::ios_base::~ios_base(local_190);
          }
          else {
            pIVar4 = cmComputeLinkInformation::GetItems(this_01);
            pIVar1 = (pIVar4->
                     super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pIVar9 = (pIVar4->
                          super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                          )._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar1;
                pIVar9 = pIVar9 + 1) {
              pcVar2 = pIVar9->Target;
              if (pcVar2 != (cmGeneratorTarget *)0x0) {
                local_200._0_8_ = local_200 + 0x10;
                local_220._M_dataplus._M_p = (pointer)0x19;
                local_200._0_8_ =
                     std::__cxx11::string::_M_create((ulong *)local_200,(ulong)&local_220);
                local_200._16_8_ = local_220._M_dataplus._M_p;
                builtin_strncpy((char *)(local_200._0_8_ + 9),"E_INTERF",8);
                builtin_strncpy((char *)(local_200._0_8_ + 0x11),"ACE_BOOL",8);
                *(undefined8 *)local_200._0_8_ = 0x42495441504d4f43;
                *(undefined8 *)(local_200._0_8_ + 8) = 0x5245544e495f454c;
                local_200._8_8_ = local_220._M_dataplus._M_p;
                *(char *)(local_200._0_8_ + (long)local_220._M_dataplus._M_p) = '\0';
                getPropertyContents(pcVar2,(string *)local_200,
                                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_78);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
                }
                pcVar2 = pIVar9->Target;
                local_200._0_8_ = local_200 + 0x10;
                local_220._M_dataplus._M_p = (pointer)0x1b;
                local_200._0_8_ =
                     std::__cxx11::string::_M_create((ulong *)local_200,(ulong)&local_220);
                local_200._16_8_ = local_220._M_dataplus._M_p;
                builtin_strncpy((char *)(local_200._0_8_ + 0xb),"INTERFAC",8);
                builtin_strncpy((char *)(local_200._0_8_ + 0x13),"E_STRING",8);
                *(undefined8 *)local_200._0_8_ = 0x42495441504d4f43;
                *(undefined8 *)(local_200._0_8_ + 8) = 0x5245544e495f454c;
                local_200._8_8_ = local_220._M_dataplus._M_p;
                *(char *)(local_200._0_8_ + (long)local_220._M_dataplus._M_p) = '\0';
                getPropertyContents(pcVar2,(string *)local_200,
                                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_78);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
                }
                pcVar2 = pIVar9->Target;
                local_200._0_8_ = local_200 + 0x10;
                local_220._M_dataplus._M_p = (pointer)0x1f;
                local_200._0_8_ =
                     std::__cxx11::string::_M_create((ulong *)local_200,(ulong)&local_220);
                local_200._16_8_ = local_220._M_dataplus._M_p;
                builtin_strncpy((char *)(local_200._0_8_ + 0xf),"RFACE_NU",8);
                builtin_strncpy((char *)(local_200._0_8_ + 0x17),"MBER_MIN",8);
                *(undefined8 *)local_200._0_8_ = 0x42495441504d4f43;
                *(undefined8 *)(local_200._0_8_ + 8) = 0x5245544e495f454c;
                local_200._8_8_ = local_220._M_dataplus._M_p;
                *(char *)(local_200._0_8_ + (long)local_220._M_dataplus._M_p) = '\0';
                getPropertyContents(pcVar2,(string *)local_200,
                                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_78);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
                }
                pcVar2 = pIVar9->Target;
                local_200._0_8_ = local_200 + 0x10;
                local_220._M_dataplus._M_p = (pointer)0x1f;
                local_200._0_8_ =
                     std::__cxx11::string::_M_create((ulong *)local_200,(ulong)&local_220);
                local_200._16_8_ = local_220._M_dataplus._M_p;
                builtin_strncpy((char *)(local_200._0_8_ + 0xf),"RFACE_NU",8);
                builtin_strncpy((char *)(local_200._0_8_ + 0x17),"MBER_MAX",8);
                *(undefined8 *)local_200._0_8_ = 0x42495441504d4f43;
                *(undefined8 *)(local_200._0_8_ + 8) = 0x5245544e495f454c;
                local_200._8_8_ = local_220._M_dataplus._M_p;
                *(char *)(local_200._0_8_ + (long)local_220._M_dataplus._M_p) = '\0';
                getPropertyContents(pcVar2,(string *)local_200,
                                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_78);
                if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                  operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
                }
              }
            }
          }
        }
        local_228 = local_228 + 1;
        properties = local_88;
      } while (local_228 != local_80);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_78._M_impl.super__Rb_tree_header) {
    p_Var7 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar8 = (cmExportFileGenerator *)local_200;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     "INTERFACE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1));
      PopulateInterfaceProperty(pcVar8,(string *)local_200,gtarget,properties);
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_78._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateCompatibleInterfaceProperties(
  cmGeneratorTarget const* gtarget, ImportPropertyMap& properties)
{
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_BOOL", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_STRING", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MIN", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MAX", gtarget,
                                  properties);

  std::set<std::string> ifaceProperties;

  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_BOOL", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_STRING", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                      ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                      ifaceProperties);

  if (gtarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    std::vector<std::string> configNames =
      gtarget->Target->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);

    for (std::string const& cn : configNames) {
      getCompatibleInterfaceProperties(gtarget, ifaceProperties, cn);
    }
  }

  for (std::string const& ip : ifaceProperties) {
    this->PopulateInterfaceProperty("INTERFACE_" + ip, gtarget, properties);
  }
}